

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [37],char *params_1)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined4 in_register_00000014;
  String *result;
  long lVar5;
  String argValues [2];
  String *pSVar6;
  undefined8 uVar7;
  String local_78;
  String local_60;
  String *local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[37]>(&local_78,(kj *)params,(char (*) [37])CONCAT44(in_register_00000014,line));
  cVar1 = *params_1;
  heapString(&local_60,1);
  if ((char *)local_60.content.size_ != (char *)0x0) {
    local_60.content.size_ = (size_t)local_60.content.ptr;
  }
  *(char *)local_60.content.size_ = cVar1;
  pSVar6 = &local_78;
  uStack_38 = 2;
  uVar7 = 2;
  local_40 = pSVar6;
  init(this,(EVP_PKEY_CTX *)file);
  lVar5 = 0x18;
  do {
    lVar2 = *(long *)((long)&local_78.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_78.content.size_ + lVar5);
      *(undefined8 *)((long)&local_78.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_78.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0,pSVar6,uVar7);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}